

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_PlayerOnSpecialFlat(player_t *player,int floorType)

{
  DAngle angle;
  bool bVar1;
  int iVar2;
  APlayerPawn *this;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  FSoundID local_38;
  FName local_34;
  undefined8 local_30;
  
  iVar2 = Terrains.Array[floorType].DamageAmount;
  if ((iVar2 != 0) && ((level.time & Terrains.Array[floorType].DamageTimeMask) == 0)) {
    if (Terrains.Array[floorType].AllowProtection == true) {
      this = player->mo;
      do {
        this = (APlayerPawn *)
               GC::ReadBarrier<AInventory>((AInventory **)&(this->super_AActor).Inventory);
        if (this == (APlayerPawn *)0x0) {
          iVar2 = Terrains.Array[floorType].DamageAmount;
          in_XMM0_Da = extraout_XMM0_Da;
          in_XMM0_Db = extraout_XMM0_Db;
          goto LAB_00451468;
        }
        bVar1 = DObject::IsKindOf((DObject *)this,APowerIronFeet::RegistrationInfo.MyClass);
      } while (!bVar1);
    }
    else {
LAB_00451468:
      local_34.Index = Terrains.Array[floorType].DamageMOD.Index;
      local_30 = 0;
      angle.Degrees._4_4_ = in_XMM0_Db;
      angle.Degrees._0_4_ = in_XMM0_Da;
      iVar2 = P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,iVar2,&local_34,0,
                           angle);
      if ((0 < iVar2) && ((long)Terrains.Array[floorType].Splash != -1)) {
        local_38.ID = Splashes.Array[Terrains.Array[floorType].Splash].NormalSplashSound.ID;
        S_Sound(&player->mo->super_AActor,0,&local_38,1.0,1.001);
      }
    }
  }
  return;
}

Assistant:

void P_PlayerOnSpecialFlat (player_t *player, int floorType)
{
	if (Terrains[floorType].DamageAmount &&
		!(level.time & Terrains[floorType].DamageTimeMask))
	{
		AInventory *ironfeet = NULL;

		if (Terrains[floorType].AllowProtection)
		{
			for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
			{
				if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
					break;
			}
		}

		int damage = 0;
		if (ironfeet == NULL)
		{
			damage = P_DamageMobj (player->mo, NULL, NULL, Terrains[floorType].DamageAmount,
				Terrains[floorType].DamageMOD);
		}
		if (damage > 0 && Terrains[floorType].Splash != -1)
		{
			S_Sound (player->mo, CHAN_AUTO,
				Splashes[Terrains[floorType].Splash].NormalSplashSound, 1,
				ATTN_IDLE);
		}
	}
}